

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  string *extraout_RAX;
  string *psVar1;
  string basename;
  string local_38;
  
  StripProto(&local_38,filename);
  ReplaceCharacters(&local_38,"-",'_');
  ReplaceCharacters(&local_38,"/",'.');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar1 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar1) {
    operator_delete(local_38._M_dataplus._M_p);
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string ModuleName(const std::string& filename) {
  std::string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}